

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationIterator::CEBuffer::ensureAppendCapacity
          (CEBuffer *this,int32_t appCap,UErrorCode *errorCode)

{
  UBool UVar1;
  long *plVar2;
  int64_t *p;
  int32_t capacity;
  UErrorCode *errorCode_local;
  int32_t appCap_local;
  CEBuffer *this_local;
  
  p._4_4_ = MaybeStackArray<long,_40>::getCapacity(&this->buffer);
  if (p._4_4_ < this->length + appCap) {
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 == '\0') {
      do {
        if (p._4_4_ < 1000) {
          p._4_4_ = p._4_4_ << 2;
        }
        else {
          p._4_4_ = p._4_4_ << 1;
        }
      } while (p._4_4_ < this->length + appCap);
      plVar2 = MaybeStackArray<long,_40>::resize(&this->buffer,p._4_4_,this->length);
      if (plVar2 == (long *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        this_local._7_1_ = '\0';
      }
      else {
        this_local._7_1_ = '\x01';
      }
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  else {
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationIterator::CEBuffer::ensureAppendCapacity(int32_t appCap, UErrorCode &errorCode) {
    int32_t capacity = buffer.getCapacity();
    if((length + appCap) <= capacity) { return TRUE; }
    if(U_FAILURE(errorCode)) { return FALSE; }
    do {
        if(capacity < 1000) {
            capacity *= 4;
        } else {
            capacity *= 2;
        }
    } while(capacity < (length + appCap));
    int64_t *p = buffer.resize(capacity, length);
    if(p == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    return TRUE;
}